

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O1

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
          (AsyncQueue<nrg::PrioExecution> *this,_func_void_AsyncResult<int> *param,
          AsyncResult<int> *param_2)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    PrioExecution::push<void(*)(nrg::AsyncResult<int>),nrg::AsyncResult<int>&>
              (&this->queue_,param,param_2);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }